

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

size_t __thiscall llvm::cl::generic_parser_base::getOptionWidth(generic_parser_base *this,Option *O)

{
  size_t sVar1;
  uint uVar2;
  long extraout_RDX;
  long extraout_RDX_00;
  ulong uVar3;
  uint uVar4;
  
  sVar1 = (O->ArgStr).Length;
  if (sVar1 == 0) {
    uVar2 = (*this->_vptr_generic_parser_base[2])(this);
    uVar3 = 0;
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      (*this->_vptr_generic_parser_base[3])(this,(ulong)uVar4);
      if (uVar3 <= extraout_RDX_00 + 8U) {
        uVar3 = extraout_RDX_00 + 8U;
      }
    }
  }
  else {
    uVar3 = sVar1 + 6;
    uVar2 = (*this->_vptr_generic_parser_base[2])(this);
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      (*this->_vptr_generic_parser_base[3])(this,(ulong)uVar4);
      if (uVar3 <= extraout_RDX + 8U) {
        uVar3 = extraout_RDX + 8U;
      }
    }
  }
  return uVar3;
}

Assistant:

size_t generic_parser_base::getOptionWidth(const Option &O) const {
  if (O.hasArgStr()) {
    size_t Size = O.ArgStr.size() + 6;
    for (unsigned i = 0, e = getNumOptions(); i != e; ++i)
      Size = std::max(Size, getOption(i).size() + 8);
    return Size;
  } else {
    size_t BaseSize = 0;
    for (unsigned i = 0, e = getNumOptions(); i != e; ++i)
      BaseSize = std::max(BaseSize, getOption(i).size() + 8);
    return BaseSize;
  }
}